

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::visitContinueStatement
          (CheckerVisitor *this,ContinueStatement *continueStmt)

{
  VarScope *in_RSI;
  long in_RDI;
  BreakableScope *bs;
  VarScope *trunkScope;
  int *local_20;
  
  for (local_20 = *(int **)(in_RDI + 0x48); *local_20 != 0; local_20 = *(int **)(local_20 + 2)) {
  }
  VarScope::mergeUnbalanced(in_RSI,*(VarScope **)(in_RDI + 0x40));
  return;
}

Assistant:

void CheckerVisitor::visitContinueStatement(ContinueStatement *continueStmt) {
  VarScope *trunkScope = currentScope;
  BreakableScope *bs = breakScope;
  assert(bs);

  while (bs->kind != BSK_LOOP)
    bs = bs->parent;

  assert(bs->loopScope);

  bs->loopScope->mergeUnbalanced(trunkScope);
}